

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

Result __thiscall
spectest::JSONParser::ParseConstValue
          (JSONParser *this,Type type,Value *out_value,ExpectedNan *out_nan,string_view value_str,
          AllowExpected allow_expected)

{
  Result RVar1;
  int iVar2;
  ulong uVar3;
  size_type __rlen;
  uint32_t value;
  undefined8 local_38;
  Type local_30;
  
  *out_nan = None;
  local_30.enum_ = type.enum_;
  local_30 = type;
  switch(local_30.enum_) {
  case ExternRef:
    if ((value_str._M_len != 4) || (iVar2 = bcmp(value_str._M_str,"null",4), iVar2 != 0)) {
      RVar1 = ParseI32Value(this,(uint32_t *)&local_38,value_str);
      if (RVar1.enum_ == Error) {
        return (Result)Error;
      }
      uVar3 = (ulong)((u32)local_38 + 1);
      goto LAB_00124463;
    }
    goto LAB_00124459;
  case FuncRef:
    if ((value_str._M_len != 4) || (iVar2 = bcmp(value_str._M_str,"null",4), iVar2 != 0)) {
      if (allow_expected == Yes) {
        (out_value->field_0).i64_ = 1;
        return (Result)Ok;
      }
      __assert_fail("allow_expected == AllowExpected::Yes",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/spectest-interp.cc"
                    ,0x32d,
                    "wabt::Result spectest::JSONParser::ParseConstValue(Type, Value *, ExpectedNan *, std::string_view, AllowExpected)"
                   );
    }
LAB_00124459:
    uVar3 = 0;
LAB_00124463:
    (out_value->field_0).i64_ = uVar3;
    return (Result)Ok;
  default:
    ParseConstValue();
    break;
  case V128:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/spectest-interp.cc"
                  ,0x326,
                  "wabt::Result spectest::JSONParser::ParseConstValue(Type, Value *, ExpectedNan *, std::string_view, AllowExpected)"
                 );
  case F64:
    RVar1 = ParseF64Value(this,&local_38,out_nan,value_str,allow_expected);
    if (RVar1.enum_ != Error) {
      (out_value->field_0).i64_ = CONCAT44(local_38._4_4_,(u32)local_38);
      return (Result)Ok;
    }
    break;
  case F32:
    RVar1 = ParseF32Value(this,(uint32_t *)&local_38,out_nan,value_str,allow_expected);
    if (RVar1.enum_ != Error) {
      (out_value->field_0).i32_ = (u32)local_38;
      return (Result)Ok;
    }
    break;
  case I64:
    RVar1 = ParseI64Value(this,&local_38,value_str);
    if (RVar1.enum_ == Error) {
      return (Result)Error;
    }
    uVar3 = CONCAT44(local_38._4_4_,(u32)local_38);
    goto LAB_00124463;
  case I32:
    RVar1 = ParseI32Value(this,(uint32_t *)&local_38,value_str);
    if (RVar1.enum_ != Error) {
      (out_value->field_0).i32_ = (u32)local_38;
      return (Result)Ok;
    }
  }
  return (Result)Error;
}

Assistant:

wabt::Result JSONParser::ParseConstValue(Type type,
                                         Value* out_value,
                                         ExpectedNan* out_nan,
                                         std::string_view value_str,
                                         AllowExpected allow_expected) {
  *out_nan = ExpectedNan::None;

  switch (type) {
    case Type::I32: {
      uint32_t value;
      CHECK_RESULT(ParseI32Value(&value, value_str));
      out_value->Set(value);
      break;
    }

    case Type::F32: {
      uint32_t value_bits;
      CHECK_RESULT(
          ParseF32Value(&value_bits, out_nan, value_str, allow_expected));
      out_value->Set(Bitcast<f32>(value_bits));
      break;
    }

    case Type::I64: {
      uint64_t value;
      CHECK_RESULT(ParseI64Value(&value, value_str));
      out_value->Set(value);
      break;
    }

    case Type::F64: {
      uint64_t value_bits;
      CHECK_RESULT(
          ParseF64Value(&value_bits, out_nan, value_str, allow_expected));
      out_value->Set(Bitcast<f64>(value_bits));
      break;
    }

    case Type::V128:
      assert(false);  // Should use ParseLaneConstValue instead.
      break;

    case Type::FuncRef:
      if (value_str == "null") {
        out_value->Set(Ref::Null);
      } else {
        assert(allow_expected == AllowExpected::Yes);
        out_value->Set(Ref{1});
      }
      break;

    case Type::ExternRef:
      if (value_str == "null") {
        out_value->Set(Ref::Null);
      } else {
        uint32_t value;
        CHECK_RESULT(ParseI32Value(&value, value_str));
        // TODO: hack, just whatever ref is at this index; but skip null (which
        // is always 0).
        out_value->Set(Ref{value + 1});
      }
      break;

    default:
      PrintError("unknown concrete type: \"%s\"", type.GetName().c_str());
      return wabt::Result::Error;
  }

  return wabt::Result::Ok;
}